

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O3

void __thiscall FIX::DataDictionary::addFieldName(DataDictionary *this,int field,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  mapped_type *pmVar3;
  ConfigError *this_00;
  long *plVar4;
  size_type *psVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar6;
  int local_7c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_78.first.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_7c = field;
  local_78.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + name->_M_string_length);
  local_78.second = field;
  pVar6 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)(this + 0x250),&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.first._M_dataplus._M_p,local_78.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(this + 0x220),&local_7c);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    return;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_50,"Field named ",name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_78.first._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_78.first._M_dataplus._M_p == psVar5) {
    local_78.first.field_2._M_allocated_capacity = *psVar5;
    local_78.first.field_2._8_8_ = plVar4[3];
    local_78.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_78.first.field_2._M_allocated_capacity = *psVar5;
  }
  local_78.first._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ConfigError::ConfigError(this_00,&local_78.first);
  __cxa_throw(this_00,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

void addFieldName(int field, const std::string &name) {
    if (m_names.insert(std::make_pair(name, field)).second == false) {
      throw ConfigError("Field named " + name + " defined multiple times");
    }
    m_fieldNames[field] = name;
  }